

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalBase<int> *sig)

{
  allocator<const_dynamicgraph::SignalBase<int>_*> local_19;
  SignalBase<int> *local_18;
  SignalBase<int> *sig_local;
  SignalArray_const<int> *this_local;
  
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_001577e8;
  local_18 = sig;
  sig_local = (SignalBase<int> *)this;
  std::allocator<const_dynamicgraph::SignalBase<int>_*>::allocator(&local_19);
  std::
  vector<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::vector(&this->const_array,0x14,&local_19);
  std::allocator<const_dynamicgraph::SignalBase<int>_*>::~allocator(&local_19);
  this->size = 0x14;
  this->rank = 0;
  addElmt(this,local_18);
  return;
}

Assistant:

SignalArray_const<Time>(const SignalBase<Time> &sig)
      : const_array(DEFAULT_SIZE), size(DEFAULT_SIZE), rank(0) {
    addElmt(&sig);
  }